

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O1

void av1_mc_flow_dispenser_row
               (AV1_COMP *cpi,TplTxfmStats *tpl_txfm_stats,TplBuffers *tpl_tmp_buffers,MACROBLOCK *x
               ,int mi_row,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  _Bool _Var6;
  char cVar7;
  int iVar8;
  int_mv iVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  AV1_PRIMARY *pAVar12;
  YV12_BUFFER_CONFIG *pYVar13;
  TplDepFrame *pTVar14;
  YV12_BUFFER_CONFIG *pYVar15;
  center_mv_t cVar16;
  center_mv_t cVar17;
  scale_factors *scale;
  TplDepStats *pTVar18;
  uint uVar19;
  uint8_t *puVar20;
  undefined8 uVar21;
  TplDepStats *pTVar22;
  AV1_COMP *cpi_00;
  tran_low_t *ptVar23;
  int16_t *piVar24;
  BitDepthInfo BVar25;
  InterpFilterParams *pIVar26;
  InterpFilterParams *pIVar27;
  int64_t iVar28;
  int32_t iVar29;
  int mi_ext_col;
  int iVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  long diff_stride;
  long lVar34;
  long lVar35;
  MB_MODE_INFO *pMVar36;
  search_site_config *search_sites;
  buf_2d *pbVar37;
  short sVar38;
  undefined4 uVar39;
  uint uVar40;
  uint8_t *puVar41;
  int *cost_list_00;
  ulong uVar42;
  int iVar43;
  int iVar44;
  MB_MODE_INFO **ppMVar45;
  ulong uVar46;
  undefined2 *puVar47;
  int iVar48;
  FULLPEL_MV start_mv;
  SequenceHeader *pSVar49;
  ulong uVar50;
  int_mv *cur_mv;
  int iVar51;
  short sVar52;
  int iVar53;
  AV1_PRIMARY *pAVar54;
  uint uVar55;
  long lVar56;
  byte bVar57;
  uint dst_stride;
  uint uVar58;
  int iVar59;
  undefined4 in_register_00000084;
  byte bVar61;
  char cVar62;
  char cVar63;
  undefined7 in_register_00000089;
  int8_t ref_idx;
  uint uVar64;
  PREDICTION_MODE mode;
  SequenceHeader *pSVar65;
  buf_2d (*pabVar66) [3];
  MACROBLOCK *x_00;
  byte bVar67;
  int iVar68;
  AV1TplRowMultiThreadSync *pAVar69;
  TX_SIZE TVar70;
  int ref;
  buf_2d *pbVar71;
  bool bVar73;
  uint local_548;
  int rate_cost;
  AV1_COMP *local_540;
  undefined8 local_538;
  uint8_t *local_530;
  scale_factors *local_528;
  int_mv this_mv;
  byte local_519;
  ulong local_518;
  uint local_50c;
  ulong local_508;
  ulong local_500;
  uint8_t *local_4f8;
  long local_4f0;
  MACROBLOCK *local_4e8;
  int64_t recon_error;
  undefined8 local_4d8;
  undefined4 local_4d0;
  int local_4cc;
  int local_4c8;
  int_mv best_rfidx_mv;
  ulong local_4c0;
  tran_low_t *local_4b8;
  int16_t *local_4b0;
  ulong local_4a8;
  ulong local_4a0;
  SequenceHeader *local_498;
  int64_t pred_error;
  ulong local_488;
  AV1_PRIMARY *local_480;
  TplDepFrame *local_478;
  int local_46c;
  int local_468;
  int local_464;
  uint local_460;
  MV local_45c;
  BitDepthInfo local_458;
  uint8_t *local_450;
  AV1_COMMON *local_448;
  uint8_t *local_440;
  MACROBLOCKD *local_438;
  tran_low_t *local_430;
  tran_low_t *local_428;
  ulong local_420;
  ulong local_418;
  int local_410;
  uint local_40c;
  int local_408;
  int rec_stride_pool [3];
  center_mv_t center_mvs [4];
  uint local_3c8;
  int cost_list [5];
  uint8_t *local_348;
  uint8_t *local_340;
  uint8_t *puStack_338;
  long local_328;
  AV1TplRowMultiThreadSync *local_320;
  ulong local_318;
  ulong local_310;
  TplDepFrame *local_308;
  buf_2d *local_300;
  MB_MODE_INFO_EXT *local_2f8;
  InterpFilterParams *local_2f0;
  InterpFilterParams *local_2e8;
  uint32_t sse;
  int distortion;
  FULLPEL_MV_STATS best_mv_stats;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  TplDepStats tpl_stats;
  int_mv single_mv [7];
  buf_2d yv12_mb [2] [3];
  ulong uVar60;
  ulong uVar72;
  
  local_4c0 = CONCAT44(in_register_00000084,mi_row);
  local_4d0 = (undefined4)CONCAT71(in_register_00000089,bsize);
  local_500 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  bVar4 = ""[local_500];
  iVar8 = (cpi->common).mi_params.mi_cols;
  bVar67 = ""[local_500];
  iVar51 = ((1 << (bVar67 & 0x1f)) >> 1) + mi_row >> (bVar67 & 0x1f);
  if (0 < iVar8) {
    bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[local_500];
    pAVar12 = cpi->ppi;
    local_308 = (pAVar12->tpl_data).tpl_frame + (pAVar12->tpl_data).frame_idx;
    dst_stride = 4 << (bVar4 & 0x1f);
    uVar60 = (ulong)dst_stride;
    local_4c8 = 4 << (bVar67 & 0x1f);
    local_310 = 0x3efffcL >> ((byte)local_500 & 0x3f);
    local_318 = 0x20005L >> ((byte)local_500 & 0x3f);
    local_464 = local_4c8 * dst_stride;
    diff_stride = (long)(int)dst_stride;
    local_2e8 = av1_interp_filter_params_list;
    local_2f0 = av1_interp_filter_params_list;
    if ((int)dst_stride < 5) {
      local_2f0 = av1_interp_4tap;
    }
    if (local_4c8 < 5) {
      local_2e8 = av1_interp_4tap;
    }
    pAVar69 = &(pAVar12->tpl_data).tpl_mt_sync;
    local_448 = &cpi->common;
    local_4cc = mi_row * 4;
    local_438 = &x->e_mbd;
    local_40c = (uint)bVar5 * 4;
    local_4a8 = (ulong)tx_size;
    local_410 = dst_stride - 1;
    local_2f8 = &x->mbmi_ext;
    local_328 = uVar60 * 2;
    local_300 = (x->e_mbd).plane[0].pre;
    local_46c = 0;
    local_518 = 0;
    local_468 = 0;
    local_540 = cpi;
    local_519 = bVar5;
    local_4e8 = x;
    local_320 = pAVar69;
    do {
      (*(cpi->mt_info).tpl_row_mt.sync_read_ptr)(pAVar69,iVar51,local_468);
      if (1 < (cpi->mt_info).num_workers) {
        pthread_mutex_lock((pthread_mutex_t *)(cpi->mt_info).tpl_row_mt.mutex_);
        _Var6 = (local_540->mt_info).tpl_row_mt.tpl_mt_exit;
        pthread_mutex_unlock((pthread_mutex_t *)(cpi->mt_info).tpl_row_mt.mutex_);
        cpi = local_540;
        if (_Var6 != false) {
          return;
        }
      }
      iVar30 = (pAVar12->tpl_data).border_in_pixels;
      iVar44 = (int)local_518;
      iVar43 = 8 - (iVar30 + iVar44 * 4);
      uVar19 = (uint)bVar5;
      uVar58 = iVar44 + uVar19;
      iVar53 = uVar58 * -4 + -8;
      if (iVar53 < iVar43) {
        iVar53 = iVar43;
      }
      (x->mv_limits).col_min = iVar53;
      iVar43 = (cpi->common).mi_params.mi_cols - iVar44;
      iVar53 = iVar43 * 4 + 8;
      iVar30 = iVar30 + (iVar43 - uVar19) * 4 + -8;
      if (iVar30 < iVar53) {
        iVar53 = iVar30;
      }
      (x->mv_limits).col_max = iVar53;
      (x->e_mbd).mb_to_left_edge = iVar44 * -0x20;
      iVar68 = (cpi->common).mi_params.mi_cols - uVar58;
      (x->e_mbd).mb_to_right_edge = iVar68 * 8;
      local_538 = (SequenceHeader *)(ulong)(uint)(x->e_mbd).bd;
      pYVar13 = (x->e_mbd).cur_buf;
      local_480 = cpi->ppi;
      pTVar14 = (local_480->tpl_data).tpl_frame;
      iVar30 = (local_480->tpl_data).frame_idx;
      local_478 = pTVar14 + iVar30;
      local_460 = (uint)(local_480->tpl_data).tpl_stats_block_mis_log2;
      iVar53 = (pYVar13->field_0).field_0.y_width;
      iVar43 = (pYVar13->field_4).field_0.y_stride;
      local_530 = (pYVar13->field_5).buffers[0];
      pYVar15 = pTVar14[iVar30].rec_picture;
      rec_stride_pool[0] = (pYVar15->field_4).field_0.y_stride;
      local_528 = (scale_factors *)(long)rec_stride_pool[0];
      local_440 = (pYVar15->field_5).buffers[0];
      local_420 = (ulong)(uint)(cpi->sf).tpl_sf.use_y_only_rate_distortion;
      local_340 = (pYVar15->field_5).field_0.u_buffer;
      puStack_338 = (pYVar15->field_5).field_0.v_buffer;
      rec_stride_pool[1] = (pYVar15->field_4).field_0.uv_stride;
      uVar55 = (uint)pYVar13->flags >> 3 & 1;
      local_458 = (BitDepthInfo)(ulong)uVar55;
      uVar3 = *(undefined8 *)&pYVar13->subsampling_x;
      iVar48 = iVar43 * local_4cc;
      local_4f8 = (uint8_t *)(ulong)(uint)(rec_stride_pool[0] * local_4cc);
      iVar30 = iVar44 * 4;
      local_4f0 = CONCAT44(local_4f0._4_4_,iVar43);
      lVar34 = (long)iVar43;
      lVar35 = 0xbe4;
      do {
        *(undefined8 *)((long)&x->plane[0].src_diff + lVar35) = uVar3;
        lVar35 = lVar35 + 0xa30;
      } while (lVar35 != 0x2044);
      local_498 = (SequenceHeader *)CONCAT71(local_498._1_7_,(local_318 & 1) == 0);
      local_4b0 = tpl_tmp_buffers->src_diff;
      local_4b8 = tpl_tmp_buffers->coeff;
      local_430 = tpl_tmp_buffers->qcoeff;
      local_428 = tpl_tmp_buffers->dqcoeff;
      local_450 = (uint8_t *)((ulong)tpl_tmp_buffers->predictor8 >> 1);
      if (uVar55 == 0) {
        local_450 = tpl_tmp_buffers->predictor8;
      }
      recon_error = 1;
      pred_error = 1;
      rec_stride_pool[2] = rec_stride_pool[1];
      local_348 = local_440;
      memset(&tpl_stats,0,200);
      tpl_stats.ref_frame_index[0] = -1;
      tpl_stats.ref_frame_index[1] = -1;
      bVar67 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [local_500];
      local_418 = (ulong)bVar67;
      iVar43 = (local_540->common).mi_params.mi_stride;
      uVar33 = (uint)local_4c0;
      uVar64 = (uint)local_518;
      iVar32 = (int)((long)((ulong)(uint)((int)uVar33 >> 0x1f) << 0x20 | local_4c0 & 0xffffffff) /
                    (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                     [(local_540->common).mi_params.mi_alloc_bsize]);
      iVar31 = (int)((long)((ulong)(uint)((int)uVar64 >> 0x1f) << 0x20 | local_518 & 0xffffffff) /
                    (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                     [(local_540->common).mi_params.mi_alloc_bsize]);
      iVar59 = iVar43 * uVar33 + uVar64;
      (local_540->common).mi_params.mi_grid_base[iVar59] =
           (local_540->common).mi_params.mi_alloc +
           ((local_540->common).mi_params.mi_alloc_stride * iVar32 + iVar31);
      ppMVar45 = (local_540->common).mi_params.mi_grid_base + iVar59;
      (x->e_mbd).mi = ppMVar45;
      (x->e_mbd).tx_type_map = (local_540->common).mi_params.tx_type_map + iVar59;
      (x->e_mbd).tx_type_map_stride = iVar43;
      x->mbmi_ext_frame =
           (local_540->mbmi_ext_info).frame_base +
           (iVar32 * (local_540->mbmi_ext_info).stride + iVar31);
      iVar43 = (local_540->common).mi_params.mi_rows;
      (x->e_mbd).mb_to_top_edge = mi_row * -0x20;
      (x->e_mbd).mb_to_bottom_edge = ((iVar43 - (uint)bVar67) - uVar33) * 0x20;
      (x->e_mbd).mb_to_left_edge = iVar44 * -0x20;
      (x->e_mbd).mb_to_right_edge = iVar68 * 0x20;
      (x->e_mbd).mi_row = uVar33;
      (x->e_mbd).mi_col = uVar64;
      iVar44 = (x->e_mbd).tile.mi_row_start;
      iVar43 = (x->e_mbd).tile.mi_col_start;
      (x->e_mbd).left_available = iVar43 < (int)uVar64;
      (x->e_mbd).up_available = iVar44 < (int)uVar33;
      uVar55 = (x->e_mbd).plane[1].subsampling_x;
      uVar40 = (x->e_mbd).plane[1].subsampling_y;
      (x->e_mbd).chroma_up_available = iVar44 < (int)uVar33;
      bVar73 = iVar43 < (int)(uVar64 - 1);
      if (uVar55 == 0) {
        bVar73 = iVar43 < (int)uVar64;
      }
      if ((local_310 & 1) != 0) {
        bVar73 = iVar43 < (int)uVar64;
      }
      (x->e_mbd).chroma_left_available = bVar73;
      if (uVar40 != 0 && (char)local_498 == '\0') {
        (x->e_mbd).chroma_up_available = iVar44 < mi_row + -1;
      }
      if (iVar44 < (int)uVar33) {
        (x->e_mbd).above_mbmi = ppMVar45[-(long)(x->e_mbd).mi_stride];
      }
      else {
        (x->e_mbd).above_mbmi = (MB_MODE_INFO *)0x0;
      }
      if (iVar43 < (int)uVar64) {
        (x->e_mbd).left_mbmi = ppMVar45[-1];
      }
      else {
        (x->e_mbd).left_mbmi = (MB_MODE_INFO *)0x0;
      }
      if (((local_4c0 & 1) == 0) && ((bVar67 & uVar40 != 0) != 0)) {
        (x->e_mbd).is_chroma_ref = false;
      }
      else {
        if ((local_518 & 1) == 0 && (local_519 & 1) != 0) {
          (x->e_mbd).is_chroma_ref = uVar55 == 0;
          if (uVar55 != 0) goto LAB_00235cd5;
        }
        else {
          (x->e_mbd).is_chroma_ref = true;
        }
        iVar44 = (x->e_mbd).mi_stride;
        iVar43 = (uVar55 & uVar64) + (uVar40 & uVar33) * iVar44;
        if ((x->e_mbd).chroma_up_available == true) {
          pMVar36 = ppMVar45[(long)-iVar43 + (long)(int)(uVar55 - iVar44)];
        }
        else {
          pMVar36 = (MB_MODE_INFO *)0x0;
        }
        (x->e_mbd).chroma_above_mbmi = pMVar36;
        if (bVar73 == false) {
          pMVar36 = (MB_MODE_INFO *)0x0;
        }
        else {
          pMVar36 = ppMVar45[(long)-iVar43 + (long)(int)(iVar44 * uVar40) + -1];
        }
        (x->e_mbd).chroma_left_mbmi = pMVar36;
      }
LAB_00235cd5:
      (x->e_mbd).height = bVar67;
      (x->e_mbd).width = local_519;
      (x->e_mbd).is_last_vertical_rect = false;
      if ((local_519 < bVar67) && ((uVar58 & bVar67 - 1) == 0)) {
        (x->e_mbd).is_last_vertical_rect = true;
      }
      local_530 = local_530 + (iVar48 + iVar30);
      local_458 = (BitDepthInfo)(((long)local_458 << 0x20) + (long)local_538);
      local_538 = (SequenceHeader *)(local_440 + ((int)local_4f8 + iVar30));
      (x->e_mbd).is_first_horizontal_rect = bVar67 < local_519 && (bVar5 - 1 & uVar33) == 0;
      lVar35 = 0xa30;
      if (((local_540->common).seq_params)->monochrome == '\0') {
        lVar35 = 0x1e90;
      }
      lVar56 = 0;
      do {
        bVar57 = (byte)((uint)bVar67 * 4 >>
                       (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar56 + -0x28) & 0x1f));
        bVar61 = (byte)(local_40c >>
                       (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar56 + -0x2c) & 0x1f));
        if (bVar61 < 5) {
          bVar61 = 4;
        }
        *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar56 + 0x90) = bVar61;
        if (bVar57 < 5) {
          bVar57 = 4;
        }
        *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar56 + 0x91) = bVar57;
        lVar56 = lVar56 + 0xa30;
      } while (lVar35 != lVar56);
      pMVar36 = *ppMVar45;
      pMVar36->bsize = (BLOCK_SIZE)local_4d0;
      pMVar36->motion_mode = '\0';
      pMVar36->ref_frame[0] = '\0';
      if (((x->e_mbd).left_available != false) &&
         ((int)(tx_size_high_unit[local_4a8] + uVar33) < (x->e_mbd).tile.mi_row_end)) {
        if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
          if (0 < (int)dst_stride) {
            puVar41 = local_440 + (long)((int)local_4f8 + local_46c) + uVar60 * (long)local_528 + -1
            ;
            uVar46 = uVar60;
            do {
              *puVar41 = *(uint8_t *)
                          ((long)local_538->operating_point_idc +
                          (long)((int)local_528 * local_410) + -0x75);
              puVar41 = puVar41 + (long)local_528;
              uVar46 = uVar46 - 1;
            } while (uVar46 != 0);
          }
        }
        else if (0 < (int)dst_stride) {
          puVar47 = (undefined2 *)(local_328 * (long)local_528 + (long)local_538 * 2 + -2);
          uVar46 = uVar60;
          do {
            *puVar47 = *(undefined2 *)
                        ((long)local_538 * 2 + -2 + (long)((int)local_528 * local_410) * 2);
            puVar47 = puVar47 + (long)local_528;
            uVar46 = uVar46 - 1;
          } while (uVar46 != 0);
        }
      }
      local_498 = (local_540->common).seq_params;
      uVar39 = 3;
      if ((local_540->sf).tpl_sf.prune_intra_modes == 0) {
        uVar39 = 0xd;
      }
      local_4a0 = CONCAT44(local_4a0._4_4_,uVar39);
      local_4f8 = (uint8_t *)CONCAT44(local_4f8._4_4_,(uint)block_size_wide[local_500]);
      local_440 = (uint8_t *)CONCAT44(local_440._4_4_,(uint)block_size_high[local_500]);
      local_50c = 0x7fffffff;
      uVar50 = 0;
      uVar46 = 0;
      puVar41 = local_450;
      do {
        TVar70 = (TX_SIZE)local_4a8;
        av1_predict_intra_block
                  (local_438,local_498->sb_size,(uint)local_498->enable_intra_edge_filter,
                   (int)local_4f8,(int)local_440,TVar70,(PREDICTION_MODE)uVar50,0,0,'\x05',
                   (uint8_t *)local_538,(int)local_528,puVar41,dst_stride,0,0,0);
        BVar25 = local_458;
        piVar24 = local_4b0;
        if (local_478->use_pred_sad == 0) {
          av1_subtract_block(local_458,local_4c8,dst_stride,local_4b0,diff_stride,local_530,lVar34,
                             local_450,diff_stride);
          puVar41 = local_450;
          ptVar23 = local_4b8;
          av1_quick_txfm(0,TVar70,BVar25,piVar24,dst_stride,local_4b8);
          uVar55 = (*aom_satd)(ptVar23,local_464);
        }
        else {
          uVar55 = (*local_540->ppi->fn_ptr[local_500].sdf)
                             (local_530,(int)local_4f0,puVar41,dst_stride);
        }
        puVar20 = local_450;
        uVar46 = uVar46 & 0xff;
        if ((int)uVar55 < (int)local_50c) {
          local_50c = uVar55;
          uVar46 = uVar50;
        }
        uVar55 = (int)uVar50 + 1;
        uVar50 = (ulong)uVar55;
      } while ((uint)local_4a0 != uVar55);
      local_508 = uVar46;
      if (local_478->use_pred_sad != 0) {
        TVar70 = (TX_SIZE)local_4a8;
        av1_predict_intra_block
                  (local_438,local_498->sb_size,(uint)local_498->enable_intra_edge_filter,
                   (int)local_4f8,(int)local_440,TVar70,(PREDICTION_MODE)uVar46,0,0,'\x05',
                   (uint8_t *)local_538,(int)local_528,local_450,dst_stride,0,0,0);
        BVar25 = local_458;
        piVar24 = local_4b0;
        av1_subtract_block(local_458,local_4c8,dst_stride,local_4b0,diff_stride,local_530,lVar34,
                           puVar20,diff_stride);
        ptVar23 = local_4b8;
        av1_quick_txfm(0,TVar70,BVar25,piVar24,dst_stride,local_4b8);
        local_50c = (*aom_satd)(ptVar23,local_464);
      }
      uVar72 = local_4a8;
      uVar50 = local_4c0;
      x_00 = local_4e8;
      rate_cost = 1;
      iVar44 = (int)local_4c0;
      iVar43 = (int)local_518;
      if (local_540->use_ducky_encode != 0) {
        get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_4b0,local_4b8,local_430,
                            local_428,local_448,local_4e8,(YV12_BUFFER_CONFIG **)0x0,&local_348,
                            rec_stride_pool,(TX_SIZE)local_4a8,(PREDICTION_MODE)uVar46,iVar44,iVar43
                            ,(int)local_420,1,(TplTxfmStats *)CONCAT44(1,local_548));
        tpl_stats.intra_dist = recon_error << 4;
        tpl_stats.intra_sse = pred_error << 4;
        tpl_stats.intra_rate = rate_cost;
      }
      (*(x_00->e_mbd).mi)->ref_frame[0] = '\0';
      (*(x_00->e_mbd).mi)->ref_frame[1] = -1;
      puVar1 = &(*(x_00->e_mbd).mi)->field_0xa7;
      *(ushort *)puVar1 = *(ushort *)puVar1 | 0x200;
      bVar67 = (byte)local_460;
      local_408 = iVar44 - (int)local_418 >> (bVar67 & 0x1f);
      local_3c8 = (uint)bVar5;
      local_4d8 = 0x8000800080008000;
      uVar55 = 0x7fffffff;
      local_488 = 0xffffffff;
      uVar46 = 0;
      pAVar54 = local_480;
      uVar42 = local_500;
      iVar48 = local_4cc;
      iVar68 = (uint)local_4f0;
      do {
        single_mv[uVar46].as_int = 0x80008000;
        if (((pAVar54->tpl_data).ref_frame[uVar46] == (YV12_BUFFER_CONFIG *)0x0) ||
           (pYVar13 = (pAVar54->tpl_data).src_ref_frame[uVar46],
           pYVar13 == (YV12_BUFFER_CONFIG *)0x0)) {
          tpl_stats.mv[uVar46].as_int = 0x80008000;
        }
        else {
          local_440 = (uint8_t *)CONCAT44(local_440._4_4_,(pYVar13->field_0).field_0.y_width);
          iVar31 = (pYVar13->field_4).field_0.y_stride;
          local_4f8 = (pYVar13->field_5).buffers[0] + (iVar31 * iVar48 + iVar30);
          best_rfidx_mv.as_int = 0;
          center_mvs[2].mv = (int_mv)0x0;
          center_mvs[2].sad = 0x7fffffff;
          center_mvs[3].mv = (int_mv)0x0;
          center_mvs[3].sad = 0x7fffffff;
          center_mvs[0].mv = (int_mv)0x0;
          center_mvs[0].sad = 0x7fffffff;
          center_mvs[1].mv = (int_mv)0x0;
          center_mvs[1].sad = 0x7fffffff;
          _Var6 = (x_00->e_mbd).up_available;
          pSVar49 = (SequenceHeader *)0x1;
          if (_Var6 == true) {
            iVar9 = (int_mv)*(int_mv *)
                             &local_478->tpl_stats_ptr
                              [local_478->stride * local_408 + (iVar43 >> (bVar67 & 0x1f))].mv
                              [uVar46].as_mv;
            iVar48 = (int)iVar9.as_int >> 0x10;
            if (iVar48 < 0) {
              iVar48 = -iVar48;
            }
            if (iVar48 < *(int *)(&DAT_0050b2a8 +
                                 (long)(local_540->sf).tpl_sf.skip_alike_starting_mv * 4)) {
              iVar48 = (int)iVar9.as_mv.row;
              if (iVar48 < 0) {
                iVar48 = -iVar48;
              }
              if (iVar48 < *(int *)(&DAT_0050b2a8 +
                                   (long)(local_540->sf).tpl_sf.skip_alike_starting_mv * 4))
              goto LAB_00236433;
            }
            center_mvs[1].sad = 0x7fffffff;
            center_mvs[1].mv._0_2_ = iVar9._0_2_;
            center_mvs[1].mv._2_2_ = iVar9._2_2_;
            pSVar49 = (SequenceHeader *)0x2;
          }
LAB_00236433:
          local_4a0 = uVar46;
          local_460 = uVar55;
          if ((x_00->e_mbd).left_available == true) {
            iVar9 = local_478->tpl_stats_ptr
                    [local_478->stride * (iVar44 >> (bVar67 & 0x1f)) +
                     ((int)(iVar43 - local_3c8) >> (bVar67 & 0x1f))].mv[uVar46];
            iVar48 = is_alike_mv(iVar9,center_mvs,(int)pSVar49,
                                 (local_540->sf).tpl_sf.skip_alike_starting_mv);
            uVar42 = local_500;
            if (iVar48 == 0) {
              center_mvs[(long)pSVar49].mv = iVar9;
              pSVar49 = (SequenceHeader *)(ulong)((int)pSVar49 + 1);
            }
          }
          if ((_Var6 != false) && ((int)uVar58 < (x_00->e_mbd).tile.mi_col_end)) {
            iVar9 = local_478->tpl_stats_ptr
                    [local_478->stride * local_408 + ((int)uVar58 >> (bVar67 & 0x1f))].mv[local_4a0]
            ;
            iVar48 = is_alike_mv(iVar9,center_mvs,(int)pSVar49,
                                 (local_540->sf).tpl_sf.skip_alike_starting_mv);
            uVar42 = local_500;
            if (iVar48 == 0) {
              center_mvs[(long)pSVar49].mv = iVar9;
              pSVar49 = (SequenceHeader *)(ulong)((int)pSVar49 + 1);
            }
          }
          puVar20 = local_4f8;
          puVar41 = local_530;
          local_528 = (scale_factors *)CONCAT44(local_528._4_4_,iVar31);
          if (1 < (uint)pSVar49 && (local_540->sf).tpl_sf.prune_starting_mv != 0) {
            pSVar65 = (SequenceHeader *)0x0;
            local_538 = pSVar49;
            local_498 = pSVar49;
            do {
              uVar55 = (uint)center_mvs[(long)pSVar65].mv.as_mv.row;
              uVar40 = (uint)center_mvs[(long)pSVar65].mv.as_mv.col;
              iVar59 = (int)((uVar40 - ((int)~uVar40 >> 0x1f)) + 3) >> 3;
              iVar48 = (x_00->mv_limits).col_min;
              iVar32 = (x_00->mv_limits).col_max;
              if (iVar59 < iVar32) {
                iVar32 = iVar59;
              }
              sVar52 = (short)iVar32;
              if (iVar59 < iVar48) {
                sVar52 = (short)iVar48;
              }
              iVar32 = (int)((uVar55 - ((int)~uVar55 >> 0x1f)) + 3) >> 3;
              iVar48 = (x_00->mv_limits).row_max;
              if (iVar32 < iVar48) {
                iVar48 = iVar32;
              }
              sVar38 = (short)iVar48;
              iVar48 = (x_00->mv_limits).row_min;
              if (iVar32 < iVar48) {
                sVar38 = (short)iVar48;
              }
              uVar55 = (*local_540->ppi->fn_ptr[uVar42].sdf)
                                 (puVar41,iVar68,puVar20 + ((int)sVar52 + sVar38 * iVar31),iVar31);
              iVar31 = (int)local_528;
              center_mvs[(long)pSVar65].sad = uVar55;
              pSVar65 = (SequenceHeader *)((long)&pSVar65->num_bits_width + 1);
            } while (local_538 != pSVar65);
            qsort(center_mvs,(size_t)local_538,8,compare_sad);
            uVar55 = 4 - (local_540->sf).tpl_sf.prune_starting_mv;
            pSVar49 = (SequenceHeader *)((ulong)local_498 & 0xffffffff);
            if ((int)uVar55 < (int)local_498) {
              pSVar49 = (SequenceHeader *)(ulong)uVar55;
            }
            iVar48 = (int)pSVar49;
            if ((1 < iVar48) &&
               (center_mvs[iVar48 - 2].sad <
                (center_mvs[iVar48 - 1U].sad - center_mvs[iVar48 - 2].sad) * 5)) {
              pSVar49 = (SequenceHeader *)(ulong)(iVar48 - 1U);
            }
            iVar68 = (uint)local_4f0;
          }
          local_538 = (SequenceHeader *)(CONCAT44(local_538._4_4_,local_4d0) & 0xffffffff000000ff);
          if (0 < (int)pSVar49) {
            uVar55 = 0xffffffff;
            pSVar65 = (SequenceHeader *)0x0;
            local_498 = pSVar49;
            do {
              cpi_00 = local_540;
              local_45c = center_mvs[(long)pSVar65].mv.as_mv;
              start_mv = (FULLPEL_MV)
                         (((int)local_45c.row - (~(int)local_45c.row >> 0x1f)) + 3U >> 3 & 0xffff |
                         ((int)local_45c.col - (~(int)local_45c.col >> 0x1f)) * 0x2000 + 0x6000U &
                         0xffff0000);
              local_4e8->plane[0].src.buf = local_530;
              local_4e8->plane[0].src.stride = iVar68;
              local_4e8->plane[0].src.width = iVar53;
              (local_4e8->e_mbd).plane[0].pre[0].buf = local_4f8;
              (local_4e8->e_mbd).plane[0].pre[0].stride = iVar31;
              (local_4e8->e_mbd).plane[0].pre[0].width = (int)local_440;
              iVar48 = (local_540->sf).tpl_sf.reduce_first_step_size;
              if (8 < iVar48) {
                iVar48 = 9;
              }
              search_sites = (local_540->mv_search_params).search_site_cfg[1];
              if ((local_540->mv_search_params).search_site_cfg[0][0].stride == iVar31) {
                search_sites = (local_540->mv_search_params).search_site_cfg[0];
              }
              av1_make_default_fullpel_ms_params
                        (&full_ms_params,local_540,local_4e8,(BLOCK_SIZE)local_538,&local_45c,
                         start_mv,search_sites,(local_540->sf).tpl_sf.search_method,0);
              if ((cpi_00->sf).mv_sf.subpel_search_method == '\0') {
                cost_list_00 = (int *)0x0;
              }
              else {
                cost_list_00 = cost_list;
                if ((cpi_00->sf).mv_sf.use_fullpel_costlist == 0) {
                  cost_list_00 = (int *)0x0;
                }
              }
              uVar40 = av1_full_pixel_search
                                 (start_mv,&full_ms_params,iVar48,cost_list_00,&this_mv.as_fullmv,
                                  &best_mv_stats,(FULLPEL_MV *)0x0);
              if ((cpi_00->sf).tpl_sf.subpel_force_stop == '\x03') {
                this_mv.as_int = (this_mv.as_int >> 0x10) * 0x80000 + (this_mv.as_int & 0x1fff) * 8;
              }
              else {
                av1_make_default_subpel_ms_params
                          ((SUBPEL_MOTION_SEARCH_PARAMS *)yv12_mb,cpi_00,local_4e8,
                           (BLOCK_SIZE)local_538,&local_45c,cost_list);
                yv12_mb[0][0].width._0_1_ = (cpi_00->sf).tpl_sf.subpel_force_stop;
                yv12_mb[1][0].buf._0_1_ = 1;
                yv12_mb[0][1].height._0_1_ = 4;
                best_mv_stats.err_cost = 0;
                uVar40 = (*(cpi_00->mv_search_params).find_fractional_mv_step)
                                   (local_438,local_448,(SUBPEL_MOTION_SEARCH_PARAMS *)yv12_mb,
                                    (MV)((this_mv.as_int >> 0x10) * 0x80000 +
                                        (this_mv.as_int & 0x1fff) * 8),&best_mv_stats,(MV *)&this_mv
                                    ,&distortion,&sse,(int_mv *)0x0);
              }
              if (uVar40 < uVar55) {
                best_rfidx_mv = this_mv;
                uVar55 = uVar40;
              }
              pSVar65 = (SequenceHeader *)((long)&pSVar65->num_bits_width + 1);
              iVar68 = (uint)local_4f0;
              iVar31 = (int)local_528;
            } while (local_498 != pSVar65);
          }
          uVar46 = local_4a0;
          uVar72 = local_4a8;
          uVar50 = local_4c0;
          tpl_stats.mv[local_4a0] = best_rfidx_mv;
          single_mv[local_4a0] = best_rfidx_mv;
          uVar40 = get_inter_cost(local_540,local_438,local_530,iVar68,tpl_tmp_buffers,
                                  (BLOCK_SIZE)local_538,(TX_SIZE)local_4a8,(int)local_4c0,
                                  (int)local_518,(int)local_4a0,&best_rfidx_mv.as_mv,
                                  local_478->use_pred_sad);
          uVar42 = 1;
          if (1 < (int)uVar40) {
            uVar42 = (ulong)uVar40;
          }
          tpl_stats.pred_error[uVar46] = uVar42;
          uVar46 = local_4a0;
          pAVar54 = local_480;
          uVar42 = local_500;
          x_00 = local_4e8;
          iVar48 = local_4cc;
          uVar55 = local_460;
          if ((int)uVar40 < (int)local_460) {
            local_4d8 = CONCAT44(local_4d8._4_4_,best_rfidx_mv.as_int);
            local_488 = local_4a0;
            uVar55 = uVar40;
          }
        }
        TVar70 = (TX_SIZE)uVar72;
        uVar46 = uVar46 + 1;
      } while (uVar46 != 7);
      uVar40 = 0x7fffffff;
      if ((uVar55 != 0x7fffffff) && (uVar40 = uVar55, local_478->use_pred_sad != 0)) {
        uVar40 = get_inter_cost(local_540,local_438,local_530,iVar68,tpl_tmp_buffers,
                                (BLOCK_SIZE)local_4d0,TVar70,(int)uVar50,(int)local_518,
                                (int)local_488,(MV *)&local_4d8,0);
        pAVar54 = local_480;
      }
      if (((int)local_488 != -1) && ((int)uVar40 < (int)local_50c)) {
        (*(x_00->e_mbd).mi)->ref_frame[0] = (char)local_488 + '\x01';
        pMVar36 = *(x_00->e_mbd).mi;
        pMVar36->mv[0].as_int = (uint32_t)local_4d8._0_4_;
        local_508 = CONCAT71((int7)((ulong)pMVar36 >> 8),0x10);
      }
      iVar44 = (local_540->sf).tpl_sf.allow_compound_pred;
      (x_00->e_mbd).mi_row = (int)uVar50;
      (x_00->e_mbd).mi_col = (int)local_518;
      if (iVar44 == 0) {
        uVar55 = 0xffffffff;
      }
      else {
        local_528 = &(pAVar54->tpl_data).sf;
        uVar55 = 0xffffffff;
        puVar41 = (uint8_t *)0x0;
        do {
          iVar44 = (&DAT_0050b230)[(long)puVar41 * 2];
          if (((pAVar54->tpl_data).ref_frame[iVar44] != (YV12_BUFFER_CONFIG *)0x0) &&
             (cVar16 = *(center_mv_t *)((pAVar54->tpl_data).src_ref_frame + iVar44),
             cVar16 != (center_mv_t)0x0)) {
            iVar53 = (&DAT_0050b234)[(long)puVar41 * 2];
            if (((pAVar54->tpl_data).ref_frame[iVar53] != (YV12_BUFFER_CONFIG *)0x0) &&
               (cVar17 = *(center_mv_t *)((pAVar54->tpl_data).src_ref_frame + iVar53),
               pAVar54 = local_480, cVar17 != (center_mv_t)0x0)) {
              local_4f0 = CONCAT44(local_4f0._4_4_,uVar40);
              center_mvs[0] = cVar16;
              center_mvs[1] = cVar17;
              (*(x_00->e_mbd).mi)->ref_frame[0] = (char)iVar44 + '\x01';
              (*(x_00->e_mbd).mi)->ref_frame[1] = (char)iVar53 + '\x01';
              ppMVar45 = (x_00->e_mbd).mi;
              pMVar36 = *ppMVar45;
              pMVar36->mode = '\x18';
              cVar63 = pMVar36->ref_frame[0];
              cVar7 = pMVar36->ref_frame[1];
              local_538 = (SequenceHeader *)CONCAT44(local_538._4_4_,uVar55);
              if ('\0' < cVar7) {
                cVar62 = -1;
                if (cVar7 < '\x05' || '\x04' < cVar63) {
                  lVar35 = 0;
                  do {
                    if ((cVar63 == (&comp_ref0_lut)[lVar35]) && (cVar7 == (&comp_ref1_lut)[lVar35]))
                    {
                      cVar62 = (char)lVar35;
                      break;
                    }
                    lVar35 = lVar35 + 1;
                  } while (lVar35 != 9);
                }
                if (cVar62 < '\0') {
                  cVar63 = cVar7 * '\x04' + cVar63 + -0xd;
                }
                else {
                  cVar63 = cVar62 + '\x14';
                }
              }
              uVar10 = single_mv[iVar44].as_int;
              *(uint32_t *)
               ((long)&local_2f8->ref_mv_stack[cVar63][0].this_mv +
               (ulong)(*(ushort *)&pMVar36->field_0xa7 >> 1 & 0x18)) = uVar10;
              uVar11 = single_mv[iVar53].as_int;
              *(uint32_t *)
               ((long)&local_2f8->ref_mv_stack[cVar63][0].comp_mv +
               (ulong)(*(ushort *)&(*ppMVar45)->field_0xa7 >> 1 & 0x18)) = uVar11;
              pabVar66 = yv12_mb;
              lVar35 = 0;
              pbVar71 = local_300;
              local_4f8 = puVar41;
              do {
                scale = (local_4e8->e_mbd).block_ref_scale_factors[lVar35];
                av1_setup_pred_block
                          (local_438,yv12_mb[lVar35],(YV12_BUFFER_CONFIG *)center_mvs[lVar35],scale,
                           scale,3);
                x_00 = local_4e8;
                lVar56 = 0;
                pbVar37 = pbVar71;
                do {
                  puVar2 = (undefined8 *)((long)&(*pabVar66)[0].buf + lVar56);
                  puVar41 = (uint8_t *)*puVar2;
                  puVar20 = (uint8_t *)puVar2[1];
                  puVar2 = (undefined8 *)((long)&(*pabVar66)[0].width + lVar56);
                  uVar3 = *puVar2;
                  uVar21 = puVar2[1];
                  pbVar37->width = (int)uVar3;
                  pbVar37->height = (int)((ulong)uVar3 >> 0x20);
                  *(undefined8 *)&pbVar37->stride = uVar21;
                  pbVar37->buf = puVar41;
                  pbVar37->buf0 = puVar20;
                  lVar56 = lVar56 + 0x20;
                  pbVar37 = (buf_2d *)((long)(pbVar37 + 0x51) + 0x10);
                } while (lVar56 != 0x60);
                pabVar66 = pabVar66 + 1;
                pbVar71 = pbVar71 + 1;
                bVar73 = lVar35 == 0;
                lVar35 = lVar35 + 1;
              } while (bVar73);
              cur_mv = (int_mv *)cost_list;
              cost_list[0] = uVar10;
              cost_list[1] = uVar11;
              av1_joint_motion_search
                        (local_540,local_4e8,(BLOCK_SIZE)local_4d0,cur_mv,(uint8_t *)0x0,0,
                         &best_mv_stats.err_cost,
                         (uint)((local_540->sf).mv_sf.disable_second_mv == 0),2);
              pIVar27 = local_2e8;
              pIVar26 = local_2f0;
              lVar35 = 0;
              do {
                cVar16 = center_mvs[lVar35];
                full_ms_params._136_8_ = *(undefined8 *)((long)cVar16 + 0x28);
                full_ms_params.fast_obmc_search = *(int *)cVar16;
                full_ms_params._148_4_ = *(undefined4 *)((long)cVar16 + 8);
                full_ms_params.mv_cost_params.ref_mv._0_4_ = *(undefined4 *)((long)cVar16 + 0x20);
                full_ms_params.mv_cost_params.mvcost[0]._0_4_ = (x_00->e_mbd).bd;
                full_ms_params.mv_cost_params.mvcost[0]._4_4_ =
                     (uint)((x_00->e_mbd).cur_buf)->flags >> 3 & 1;
                full_ms_params.force_mesh_thresh = local_4c8;
                full_ms_params.mesh_patterns[0]._0_4_ = local_4cc;
                full_ms_params.mv_cost_params.full_ref_mv.row = 0;
                full_ms_params.mv_cost_params.full_ref_mv.col = 0;
                full_ms_params.mv_cost_params.mv_cost_type = '\0';
                full_ms_params.mv_cost_params._13_3_ = 0;
                full_ms_params.sdf._4_4_ = 0;
                full_ms_params.bsize = BLOCK_4X4;
                full_ms_params._1_7_ = 0x1000000;
                full_ms_params.sdx4df = (aom_sad_multi_d_fn_t)0xfffb9000fffb9000;
                full_ms_params.mv_limits._8_8_ = pIVar26;
                full_ms_params._104_8_ = pIVar27;
                full_ms_params.mv_cost_params.mvjcost = &local_528->x_scale_fp;
                full_ms_params.mesh_patterns[1] = (MESH_PATTERN *)0x0;
                full_ms_params.ms_buffers.wsrc = (int32_t *)(x_00->e_mbd).tmp_conv_dst;
                full_ms_params.ms_buffers.obmc_mask._4_4_ =
                     (int)full_ms_params.mv_cost_params.mvcost[0] + -7;
                if ((int)full_ms_params.mv_cost_params.mvcost[0] < 0xb) {
                  full_ms_params.ms_buffers.obmc_mask._4_4_ = 3;
                }
                full_ms_params.ms_buffers.mask_stride = (int)lVar35;
                full_ms_params.ms_buffers.obmc_mask._0_4_ = 0x80;
                full_ms_params.search_method = '\a';
                full_ms_params._73_7_ = 0;
                full_ms_params.search_sites = (search_site_config *)0x1;
                full_ms_params.mesh_search_mv_diff_threshold = dst_stride;
                full_ms_params.mesh_patterns[0]._4_4_ = iVar30;
                av1_enc_build_one_inter_predictor
                          (local_450,dst_stride,&cur_mv->as_mv,(InterPredParams *)&full_ms_params);
                BVar25 = local_458;
                piVar24 = local_4b0;
                lVar35 = lVar35 + 1;
                cur_mv = cur_mv + 1;
              } while (lVar35 == 1);
              av1_subtract_block(local_458,local_4c8,dst_stride,local_4b0,diff_stride,local_530,
                                 lVar34,local_450,diff_stride);
              uVar72 = local_4a8;
              ptVar23 = local_4b8;
              av1_quick_txfm(0,(TX_SIZE)local_4a8,BVar25,piVar24,dst_stride,local_4b8);
              uVar33 = (*aom_satd)(ptVar23,local_464);
              pAVar54 = local_480;
              puVar41 = local_4f8;
              uVar55 = (uint)local_538;
              uVar40 = (uint)local_4f0;
              if ((int)uVar33 < (int)(uint)local_4f0) {
                local_4d8 = CONCAT44(cost_list[1],cost_list[0]);
                uVar55 = (uint)local_4f8;
                uVar40 = uVar33;
              }
            }
          }
          TVar70 = (TX_SIZE)uVar72;
          puVar41 = puVar41 + 1;
        } while (puVar41 != (uint8_t *)0x3);
      }
      if ((uVar55 != 0xffffffff) && ((int)uVar40 < (int)local_50c)) {
        cVar63 = *(char *)(&DAT_0050b234 + (long)(int)uVar55 * 2);
        (*(x_00->e_mbd).mi)->ref_frame[0] =
             *(char *)(&DAT_0050b230 + (long)(int)uVar55 * 2) + '\x01';
        pMVar36 = *(x_00->e_mbd).mi;
        pMVar36->ref_frame[1] = cVar63 + '\x01';
        local_508 = CONCAT71((int7)((ulong)pMVar36 >> 8),0x18);
      }
      bVar67 = (PREDICTION_MODE)local_508 - 0x19;
      local_528 = (scale_factors *)(local_508 & 0xff);
      iVar30 = (int)local_4c0;
      if ((uVar40 != 0x7fffffff) && (0xf3 < bVar67)) {
        (*(x_00->e_mbd).mi)->mv[0].as_int = (uint32_t)local_4d8._0_4_;
        (*(x_00->e_mbd).mi)->mv[1].as_int = local_4d8._4_4_;
        if ((int)uVar55 < 0) {
          full_ms_params._0_8_ = (pAVar54->tpl_data).src_ref_frame[(int)local_488];
          full_ms_params.vfp = (aom_variance_fn_ptr_t *)0x0;
        }
        else {
          full_ms_params._0_8_ =
               (pAVar54->tpl_data).src_ref_frame[(int)(&DAT_0050b230)[(ulong)uVar55 * 2]];
          full_ms_params.vfp =
               (aom_variance_fn_ptr_t *)
               (pAVar54->tpl_data).src_ref_frame[(int)(&DAT_0050b234)[(ulong)uVar55 * 2]];
        }
        rate_cost = 1;
        get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_4b0,local_4b8,local_430,
                            local_428,local_448,x_00,(YV12_BUFFER_CONFIG **)&full_ms_params,
                            &local_348,rec_stride_pool,TVar70,(PREDICTION_MODE)local_508,iVar30,
                            (int)local_518,(int)local_420,0,(TplTxfmStats *)CONCAT44(1,local_548));
        tpl_stats.srcrf_rate = rate_cost;
        pAVar54 = local_480;
      }
      tpl_stats.intra_cost = local_50c;
      if ((int)local_50c < 2) {
        tpl_stats.intra_cost = 1;
      }
      tpl_stats.inter_cost = uVar40;
      if (tpl_stats.intra_cost < (int)uVar40) {
        tpl_stats.inter_cost = tpl_stats.intra_cost;
      }
      tpl_stats.srcrf_dist = recon_error << 4;
      tpl_stats.srcrf_sse = pred_error << 4;
      rate_cost = 0;
      if ((char)local_508 == '\x18') {
        uVar46 = (ulong)(int)(&DAT_0050b230)[(long)(int)uVar55 * 2];
LAB_00237168:
        full_ms_params._0_8_ = (pAVar54->tpl_data).ref_frame[uVar46];
      }
      else {
        if (-1 < (int)local_488) {
          uVar46 = local_488 & 0xffffffff;
          goto LAB_00237168;
        }
        full_ms_params._0_8_ = (YV12_BUFFER_CONFIG *)0x0;
      }
      if ((char)local_508 == '\x18') {
        full_ms_params.vfp =
             (aom_variance_fn_ptr_t *)
             (pAVar54->tpl_data).ref_frame[(int)(&DAT_0050b234)[(long)(int)uVar55 * 2]];
      }
      else {
        full_ms_params.vfp = (aom_variance_fn_ptr_t *)0x0;
      }
      get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_4b0,local_4b8,local_430,
                          local_428,local_448,x_00,(YV12_BUFFER_CONFIG **)&full_ms_params,&local_348
                          ,rec_stride_pool,TVar70,(PREDICTION_MODE)local_528,iVar30,(int)local_518,
                          (int)local_420,1,(TplTxfmStats *)(ulong)local_548);
      pAVar54 = local_480;
      lVar34 = recon_error * 0x10;
      tpl_stats.recrf_sse = pred_error << 4;
      if (bVar67 < 0xf4) {
        tpl_stats.srcrf_rate = rate_cost;
        tpl_stats.srcrf_sse = tpl_stats.recrf_sse;
        tpl_stats.srcrf_dist = lVar34;
      }
      iVar29 = tpl_stats.srcrf_rate;
      iVar28 = tpl_stats.srcrf_dist;
      if (lVar34 < tpl_stats.srcrf_dist) {
        lVar34 = tpl_stats.srcrf_dist;
      }
      iVar30 = rate_cost;
      if (rate_cost < tpl_stats.srcrf_rate) {
        iVar30 = tpl_stats.srcrf_rate;
      }
      cVar63 = (char)local_508;
      tpl_stats.recrf_dist = lVar34;
      tpl_stats.recrf_rate = iVar30;
      if (cVar63 == '\x18') {
        local_530 = (uint8_t *)(long)(int)(&DAT_0050b230)[(long)(int)uVar55 * 2];
        full_ms_params._0_8_ = (local_480->tpl_data).ref_frame[(long)local_530];
        local_4f0 = (long)(int)(&DAT_0050b234)[(long)(int)uVar55 * 2];
        full_ms_params.vfp = (aom_variance_fn_ptr_t *)(local_480->tpl_data).src_ref_frame[local_4f0]
        ;
        local_538 = (SequenceHeader *)CONCAT44(local_538._4_4_,uVar55);
        iVar44 = (int)local_4c0;
        get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_4b0,local_4b8,local_430,
                            local_428,local_448,local_4e8,(YV12_BUFFER_CONFIG **)&full_ms_params,
                            &local_348,rec_stride_pool,(TX_SIZE)local_4a8,(PREDICTION_MODE)local_528
                            ,iVar44,(int)local_518,(int)local_420,1,
                            (TplTxfmStats *)CONCAT44(rate_cost,local_548));
        tpl_stats.cmp_recrf_dist[0] = recon_error * 0x10;
        if (recon_error * 0x10 < iVar28) {
          tpl_stats.cmp_recrf_dist[0] = iVar28;
        }
        if (rate_cost < iVar29) {
          rate_cost = iVar29;
        }
        if (lVar34 < tpl_stats.cmp_recrf_dist[0]) {
          tpl_stats.cmp_recrf_dist[0] = lVar34;
        }
        tpl_stats.cmp_recrf_rate[0] = rate_cost;
        if (iVar30 < rate_cost) {
          tpl_stats.cmp_recrf_rate[0] = iVar30;
        }
        rate_cost = 0;
        full_ms_params._0_8_ = (pAVar54->tpl_data).src_ref_frame[(long)local_530];
        full_ms_params.vfp = (aom_variance_fn_ptr_t *)(pAVar54->tpl_data).ref_frame[local_4f0];
        uVar55 = (uint)local_538;
        get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_4b0,local_4b8,local_430,
                            local_428,local_448,local_4e8,(YV12_BUFFER_CONFIG **)&full_ms_params,
                            &local_348,rec_stride_pool,(TX_SIZE)local_4a8,(PREDICTION_MODE)local_528
                            ,iVar44,(int)local_518,(int)local_420,1,(TplTxfmStats *)(ulong)local_548
                           );
        tpl_stats.cmp_recrf_dist[1] = recon_error * 0x10;
        if (recon_error * 0x10 < iVar28) {
          tpl_stats.cmp_recrf_dist[1] = iVar28;
        }
        tpl_stats.cmp_recrf_rate[1] = rate_cost;
        if (rate_cost < iVar29) {
          tpl_stats.cmp_recrf_rate[1] = iVar29;
        }
        if (lVar34 < tpl_stats.cmp_recrf_dist[1]) {
          tpl_stats.cmp_recrf_dist[1] = lVar34;
        }
        if (iVar30 < tpl_stats.cmp_recrf_rate[1]) {
          tpl_stats.cmp_recrf_rate[1] = iVar30;
        }
        cVar63 = (char)local_508;
      }
      x = local_4e8;
      if (cVar63 == '\x10') {
        *(MV *)(tpl_stats.mv + (int)local_488) = local_4d8._0_4_;
        tpl_stats.ref_frame_index[1] = -1;
        tpl_stats.ref_frame_index[0] = (int8_t)local_488;
      }
      else if (cVar63 == '\x18') {
        tpl_stats.ref_frame_index[1] = *(int8_t *)(&DAT_0050b234 + (long)(int)uVar55 * 2);
        tpl_stats.ref_frame_index[0] = *(char *)(&DAT_0050b230 + (long)(int)uVar55 * 2);
        *(MV *)(tpl_stats.mv + *(char *)(&DAT_0050b230 + (long)(int)uVar55 * 2)) = local_4d8._0_4_;
        tpl_stats.mv[tpl_stats.ref_frame_index[1]].as_int = local_4d8._4_4_;
      }
      iVar53 = (int)local_418;
      iVar30 = (local_4e8->e_mbd).mb_to_right_edge;
      iVar44 = 0;
      do {
        lVar34 = 0;
        do {
          if (((int)lVar34 < (int)((iVar30 >> 5) + uVar19)) &&
             (iVar44 - iVar53 < (local_4e8->e_mbd).mb_to_bottom_edge >> 5)) {
            ppMVar45 = (local_4e8->e_mbd).mi;
            ppMVar45[(long)iVar44 * (long)(local_540->common).mi_params.mi_stride + lVar34] =
                 *ppMVar45;
          }
          lVar34 = lVar34 + 1;
        } while ((uint)bVar5 + (uint)(bVar5 == 0) != (int)lVar34);
        iVar44 = iVar44 + 1;
      } while (iVar44 != iVar53 + (uint)(iVar53 == 0));
      bVar67 = (pAVar12->tpl_data).tpl_stats_block_mis_log2;
      pTVar18 = local_308->tpl_stats_ptr;
      iVar44 = ((int)local_518 >> (bVar67 & 0x1f)) +
               ((int)local_4c0 >> (bVar67 & 0x1f)) * local_308->stride;
      memcpy(pTVar18 + iVar44,&tpl_stats,200);
      pAVar69 = local_320;
      iVar30 = local_468;
      cpi = local_540;
      uVar46._0_4_ = pTVar18[iVar44].intra_cost;
      uVar46._4_4_ = pTVar18[iVar44].inter_cost;
      iVar53 = (int)DAT_004dbd10;
      iVar43 = DAT_004dbd10._4_4_;
      uVar50 = CONCAT44(-(uint)(iVar43 < (int)uVar46._4_4_),
                        -(uint)(iVar53 < (int)(undefined4)uVar46));
      uVar72 = (ulong)DAT_004dbd10;
      uVar46 = ~uVar50 & uVar72 | uVar46 & uVar50;
      uVar50._0_4_ = pTVar18[iVar44].srcrf_rate;
      uVar50._4_4_ = pTVar18[iVar44].recrf_rate;
      uVar42 = CONCAT44(-(uint)(iVar43 < (int)uVar50._4_4_),
                        -(uint)(iVar53 < (int)(undefined4)uVar50));
      pTVar22 = pTVar18 + iVar44;
      pTVar22->intra_cost = (int)uVar46;
      pTVar22->inter_cost = (int)(uVar46 >> 0x20);
      *(ulong *)(&pTVar22->intra_cost + 2) = ~uVar42 & uVar72 | uVar50 & uVar42;
      lVar34 = pTVar18[iVar44].srcrf_dist;
      if (lVar34 < 2) {
        lVar34 = 1;
      }
      lVar35 = pTVar18[iVar44].srcrf_sse;
      if (lVar35 < 2) {
        lVar35 = 1;
      }
      pTVar18[iVar44].srcrf_dist = lVar34;
      pTVar18[iVar44].srcrf_sse = lVar35;
      lVar34 = pTVar18[iVar44].recrf_dist;
      if (lVar34 < 2) {
        lVar34 = 1;
      }
      pTVar18[iVar44].recrf_dist = lVar34;
      lVar34 = pTVar18[iVar44].cmp_recrf_dist[0];
      if (lVar34 < 2) {
        lVar34 = 1;
      }
      pTVar18[iVar44].cmp_recrf_dist[0] = lVar34;
      lVar34 = pTVar18[iVar44].cmp_recrf_dist[1];
      if (lVar34 < 2) {
        lVar34 = 1;
      }
      pTVar18[iVar44].cmp_recrf_dist[1] = lVar34;
      uVar46 = *(ulong *)pTVar18[iVar44].cmp_recrf_rate;
      uVar50 = CONCAT44(-(uint)(iVar43 < (int)(uVar46 >> 0x20)),-(uint)(iVar53 < (int)uVar46));
      *(ulong *)pTVar18[iVar44].cmp_recrf_rate = ~uVar50 & uVar72 | uVar46 & uVar50;
      (*(local_540->mt_info).tpl_row_mt.sync_write_ptr)
                (local_320,iVar51,local_468,((1 << (bVar4 & 0x1f)) >> 1) + iVar8 >> (bVar4 & 0x1f));
      local_468 = iVar30 + 1;
      local_46c = local_46c + local_40c;
      local_518 = (ulong)uVar58;
    } while ((int)uVar58 < (cpi->common).mi_params.mi_cols);
  }
  return;
}

Assistant:

void av1_mc_flow_dispenser_row(AV1_COMP *cpi, TplTxfmStats *tpl_txfm_stats,
                               TplBuffers *tpl_tmp_buffers, MACROBLOCK *x,
                               int mi_row, BLOCK_SIZE bsize, TX_SIZE tx_size) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1TplRowMultiThreadInfo *const tpl_row_mt = &mt_info->tpl_row_mt;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int mi_width = mi_size_wide[bsize];
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_data->frame_idx];
  MACROBLOCKD *xd = &x->e_mbd;

  const int tplb_cols_in_tile =
      ROUND_POWER_OF_TWO(mi_params->mi_cols, mi_size_wide_log2[bsize]);
  const int tplb_row = ROUND_POWER_OF_TWO(mi_row, mi_size_high_log2[bsize]);
  assert(mi_size_high[bsize] == (1 << tpl_data->tpl_stats_block_mis_log2));
  assert(mi_size_wide[bsize] == (1 << tpl_data->tpl_stats_block_mis_log2));

  for (int mi_col = 0, tplb_col_in_tile = 0; mi_col < mi_params->mi_cols;
       mi_col += mi_width, tplb_col_in_tile++) {
    (*tpl_row_mt->sync_read_ptr)(&tpl_data->tpl_mt_sync, tplb_row,
                                 tplb_col_in_tile);

#if CONFIG_MULTITHREAD
    if (mt_info->num_workers > 1) {
      pthread_mutex_lock(tpl_row_mt->mutex_);
      const bool tpl_mt_exit = tpl_row_mt->tpl_mt_exit;
      pthread_mutex_unlock(tpl_row_mt->mutex_);
      // Exit in case any worker has encountered an error.
      if (tpl_mt_exit) return;
    }
#endif

    TplDepStats tpl_stats;

    // Motion estimation column boundary
    av1_set_mv_col_limits(mi_params, &x->mv_limits, mi_col, mi_width,
                          tpl_data->border_in_pixels);
    xd->mb_to_left_edge = -GET_MV_SUBPEL(mi_col * MI_SIZE);
    xd->mb_to_right_edge =
        GET_MV_SUBPEL(mi_params->mi_cols - mi_width - mi_col);
    mode_estimation(cpi, tpl_txfm_stats, tpl_tmp_buffers, x, mi_row, mi_col,
                    bsize, tx_size, &tpl_stats);

    // Motion flow dependency dispenser.
    tpl_model_store(tpl_frame->tpl_stats_ptr, mi_row, mi_col, tpl_frame->stride,
                    &tpl_stats, tpl_data->tpl_stats_block_mis_log2);
    (*tpl_row_mt->sync_write_ptr)(&tpl_data->tpl_mt_sync, tplb_row,
                                  tplb_col_in_tile, tplb_cols_in_tile);
  }
}